

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

Bac_Man_t * Bac_ManCollapse(Bac_Man_t *p)

{
  int nCapMin;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *vSigs;
  Bac_Man_t *p_00;
  char *pcVar4;
  Abc_Nam_t *pAVar5;
  Bac_Ntk_t *pBVar6;
  Bac_Ntk_t *p_01;
  int i;
  int local_34;
  
  vSigs = Vec_IntAlloc(1000);
  p_00 = (Bac_Man_t *)calloc(1,0x530);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  pAVar5 = Abc_NamRef(p->pStrs);
  p_00->pStrs = pAVar5;
  pAVar5 = Abc_NamStart(1000,0x18);
  p_00->pMods = pAVar5;
  p_00->iRoot = 1;
  p_00->nNtks = 1;
  pBVar6 = (Bac_Ntk_t *)calloc(2,0xd0);
  p_00->pNtks = pBVar6;
  pBVar6[1].pDesign = p_00;
  pBVar6 = Bac_ManRoot(p);
  p_01 = Bac_ManRoot(p_00);
  iVar2 = pBVar6->NameId;
  iVar1 = (pBVar6->vInputs).nSize;
  iVar3 = (pBVar6->vOutputs).nSize;
  nCapMin = Bac_ManClpObjNum(p);
  if (p_01->pDesign == (Bac_Man_t *)0x0) {
    __assert_fail("pNew->pDesign != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  if ((p_01->vInputs).nSize != 0) {
    __assert_fail("Bac_NtkPiNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  if ((p_01->vOutputs).nSize != 0) {
    __assert_fail("Bac_NtkPoNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
  }
  p_01->NameId = iVar2;
  p_01->iCopy = -1;
  p_01->iBoxNtk = -1;
  p_01->iBoxObj = -1;
  Vec_IntGrow(&p_01->vInputs,iVar1);
  Vec_IntGrow(&p_01->vOutputs,iVar3);
  Vec_StrGrow(&p_01->vType,nCapMin);
  Vec_IntGrow(&p_01->vFanin,nCapMin);
  pAVar5 = p_01->pDesign->pMods;
  pcVar4 = Bac_NtkStr(p_01,iVar2);
  iVar1 = Abc_NamStrFindOrAdd(pAVar5,pcVar4,&local_34);
  if (local_34 == 0) {
    iVar2 = (int)(((long)p_01 - (long)p_01->pDesign->pNtks) / 0xd0);
    if ((iVar2 < 1) || (p_01->pDesign->nNtks < iVar2)) {
      __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                    ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
    }
    if (iVar1 != iVar2) {
      __assert_fail("NtkId == Bac_NtkId(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                    ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
    }
  }
  else {
    pcVar4 = Bac_NtkStr(p_01,iVar2);
    printf("Network with name %s already exists.\n",pcVar4);
  }
  iVar2 = (pBVar6->vInfo).nSize;
  if (iVar2 != 0) {
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(&pBVar6->vInfo,iVar1);
      Vec_IntPush(&p_01->vInfo,iVar2);
      iVar2 = (pBVar6->vInfo).nSize;
    }
  }
  for (iVar2 = 0; iVar2 < (pBVar6->vInputs).nSize; iVar2 = iVar2 + 1) {
    Vec_IntEntry(&pBVar6->vInputs,iVar2);
    iVar1 = Bac_ObjAlloc(p_01,BAC_OBJ_PI,-1);
    Vec_IntPush(vSigs,iVar1);
  }
  Bac_NtkCollapse_rec(p_01,pBVar6,vSigs);
  iVar2 = vSigs->nSize;
  if (iVar2 == (pBVar6->vOutputs).nSize) {
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      Vec_IntEntry(&pBVar6->vOutputs,iVar1);
      iVar2 = Vec_IntEntry(vSigs,iVar1);
      Bac_ObjAlloc(p_01,BAC_OBJ_PO,iVar2);
      iVar2 = (pBVar6->vOutputs).nSize;
    }
    if ((p_01->vType).nSize == (p_01->vType).nCap) {
      Vec_IntFree(vSigs);
      if ((pBVar6->vName).pArray != (int *)0x0) {
        Bac_NtkStartNames(p_01);
        for (iVar2 = 0; iVar2 < (pBVar6->vInputs).nSize; iVar2 = iVar2 + 1) {
          iVar1 = Vec_IntEntry(&pBVar6->vInputs,iVar2);
          iVar3 = Vec_IntEntry(&p_01->vInputs,iVar2);
          iVar1 = Bac_ObjName(pBVar6,iVar1);
          Bac_ObjSetName(p_01,iVar3,iVar1);
        }
        for (iVar2 = 0; iVar2 < (pBVar6->vOutputs).nSize; iVar2 = iVar2 + 1) {
          iVar1 = Vec_IntEntry(&pBVar6->vOutputs,iVar2);
          iVar1 = Bac_ObjFanin(pBVar6,iVar1);
          iVar3 = Bac_ObjIsPi(pBVar6,iVar1);
          if (iVar3 == 0) {
            iVar3 = Vec_IntEntry(&pBVar6->vCopy,iVar1);
            iVar1 = Bac_ObjName(pBVar6,iVar1);
            Bac_ObjSetName(p_01,iVar3,iVar1);
          }
        }
      }
      return p_00;
    }
    __assert_fail("Bac_NtkObjNum(pRootNew) == Bac_NtkObjNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                  ,0x247,"Bac_Man_t *Bac_ManCollapse(Bac_Man_t *)");
  }
  __assert_fail("Vec_IntSize(vSigs) == Bac_NtkPoNum(pRoot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacNtk.c"
                ,0x244,"Bac_Man_t *Bac_ManCollapse(Bac_Man_t *)");
}

Assistant:

Bac_Man_t * Bac_ManCollapse( Bac_Man_t * p )
{
    int i, iObj;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    Bac_Man_t * pNew = Bac_ManStart( p, 1 );
    Bac_Ntk_t * pRoot = Bac_ManRoot( p );
    Bac_Ntk_t * pRootNew = Bac_ManRoot( pNew );
    Bac_NtkAlloc( pRootNew, Bac_NtkNameId(pRoot), Bac_NtkPiNum(pRoot), Bac_NtkPoNum(pRoot), Bac_ManClpObjNum(p) );
    if ( Vec_IntSize(&pRoot->vInfo) )
        Vec_IntAppend( &pRootNew->vInfo, &pRoot->vInfo );
    Bac_NtkForEachPi( pRoot, iObj, i )
        Vec_IntPush( vSigs, Bac_ObjAlloc(pRootNew, BAC_OBJ_PI, -1) );
    Bac_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Bac_NtkPoNum(pRoot) );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ObjAlloc( pRootNew, BAC_OBJ_PO, Vec_IntEntry(vSigs, i) );
    assert( Bac_NtkObjNum(pRootNew) == Bac_NtkObjNumAlloc(pRootNew) );
    Vec_IntFree( vSigs );
    // transfer PI/PO names
    if ( Bac_NtkHasNames(pRoot) )
    {
        Bac_NtkStartNames( pRootNew );
        Bac_NtkForEachPi( pRoot, iObj, i )
            Bac_ObjSetName( pRootNew, Bac_NtkPi(pRootNew, i), Bac_ObjName(pRoot, iObj) );
        Bac_NtkForEachPoDriver( pRoot, iObj, i )
            if ( !Bac_ObjIsPi(pRoot, iObj) )
                Bac_ObjSetName( pRootNew, Bac_ObjCopy(pRoot, iObj), Bac_ObjName(pRoot, iObj) );
    }
    return pNew;
}